

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O0

cmUVProcessChain __thiscall cmUVProcessChainBuilder::Start(cmUVProcessChainBuilder *this)

{
  bool bVar1;
  bool last;
  pointer pIVar2;
  reference config;
  const_iterator __x;
  cmUVProcessChainBuilder *in_RSI;
  __normal_iterator<const_cmUVProcessChainBuilder::ProcessConfiguration_*,_std::vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>_>
  local_50;
  __normal_iterator<const_cmUVProcessChainBuilder::ProcessConfiguration_*,_std::vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>_>
  local_48;
  __normal_iterator<const_cmUVProcessChainBuilder::ProcessConfiguration_*,_std::vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>_>
  local_40;
  __normal_iterator<const_cmUVProcessChainBuilder::ProcessConfiguration_*,_std::vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>_>
  local_38;
  const_iterator it;
  cmUVProcessChainBuilder *this_local;
  cmUVProcessChain *chain;
  
  cmUVProcessChain::cmUVProcessChain((cmUVProcessChain *)this);
  pIVar2 = std::
           unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
           ::operator->((unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                         *)this);
  bVar1 = cmUVProcessChain::InternalData::Prepare(pIVar2,in_RSI);
  if (bVar1) {
    local_38._M_current =
         (ProcessConfiguration *)
         std::
         vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
         ::begin(&in_RSI->Processes);
    while( true ) {
      local_40._M_current =
           (ProcessConfiguration *)
           std::
           vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
           ::end(&in_RSI->Processes);
      bVar1 = __gnu_cxx::operator!=(&local_38,&local_40);
      if (!bVar1) break;
      pIVar2 = std::
               unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
               ::operator->((unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                             *)this);
      config = __gnu_cxx::
               __normal_iterator<const_cmUVProcessChainBuilder::ProcessConfiguration_*,_std::vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>_>
               ::operator*(&local_38);
      local_48._M_current =
           (ProcessConfiguration *)
           std::
           vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
           ::begin(&in_RSI->Processes);
      bVar1 = __gnu_cxx::operator==(&local_38,&local_48);
      __x = std::
            vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
            ::end(&in_RSI->Processes);
      local_50 = std::
                 prev<__gnu_cxx::__normal_iterator<cmUVProcessChainBuilder::ProcessConfiguration_const*,std::vector<cmUVProcessChainBuilder::ProcessConfiguration,std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>>>>
                           ((__normal_iterator<const_cmUVProcessChainBuilder::ProcessConfiguration_*,_std::vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>_>
                             )__x._M_current,1);
      last = __gnu_cxx::operator==(&local_38,&local_50);
      bVar1 = cmUVProcessChain::InternalData::AddCommand(pIVar2,config,bVar1,last);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return (unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                )(unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                  )this;
      }
      __gnu_cxx::
      __normal_iterator<const_cmUVProcessChainBuilder::ProcessConfiguration_*,_std::vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>_>
      ::operator++(&local_38);
    }
    pIVar2 = std::
             unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
             ::operator->((unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                           *)this);
    cmUVProcessChain::InternalData::Finish(pIVar2);
  }
  return (unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
          )(unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
            )this;
}

Assistant:

cmUVProcessChain cmUVProcessChainBuilder::Start() const
{
  cmUVProcessChain chain;

  if (!chain.Data->Prepare(this)) {
    return chain;
  }

  for (auto it = this->Processes.begin(); it != this->Processes.end(); ++it) {
    if (!chain.Data->AddCommand(*it, it == this->Processes.begin(),
                                it == std::prev(this->Processes.end()))) {
      return chain;
    }
  }

  chain.Data->Finish();

  return chain;
}